

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

_Bool check_frame(cio_websocket_frame_type opcode,char *payload,size_t payload_length,
                 _Bool is_last_frame)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  size_t sVar6;
  undefined4 local_44;
  uint64_t uStack_40;
  uint8_t mask [4];
  uint64_t len_1;
  uint64_t uStack_30;
  uint16_t len;
  uint64_t length;
  _Bool is_masked;
  uint8_t first_length;
  uint8_t header;
  _Bool is_last_frame_local;
  size_t payload_length_local;
  char *payload_local;
  cio_websocket_frame_type opcode_local;
  
  sVar6 = write_buffer_parse_pos + 1;
  bVar1 = write_buffer[write_buffer_parse_pos];
  if (((bVar1 & 0x80) == 0x80) == is_last_frame) {
    if ((bVar1 & 0x70) == 0) {
      if ((bVar1 & opcode) == opcode) {
        bVar1 = write_buffer[write_buffer_parse_pos + 1];
        bVar3 = bVar1 & 0x7f;
        if (bVar3 == 0x7e) {
          lVar2 = write_buffer_parse_pos + 2;
          write_buffer_parse_pos = write_buffer_parse_pos + 4;
          uVar4 = cio_be16toh(*(uint16_t *)(write_buffer + lVar2));
          uStack_30 = (uint64_t)uVar4;
        }
        else if (bVar3 == 0x7f) {
          uStack_40 = *(uint64_t *)(write_buffer + write_buffer_parse_pos + 2);
          write_buffer_parse_pos = write_buffer_parse_pos + 10;
          uStack_40 = cio_be64toh(uStack_40);
          uStack_30 = uStack_40;
        }
        else {
          uStack_30 = (uint64_t)bVar3;
          write_buffer_parse_pos = write_buffer_parse_pos + 2;
        }
        if (uStack_30 == payload_length) {
          if ((bVar1 & 0x80) == 0x80) {
            local_44 = *(undefined4 *)(write_buffer + write_buffer_parse_pos);
            lVar2 = write_buffer_parse_pos + 4;
            write_buffer_parse_pos = write_buffer_parse_pos + 4;
            cio_websocket_mask(write_buffer + lVar2,uStack_30,(uint8_t *)&local_44);
          }
          if ((uStack_30 == 0) ||
             (iVar5 = memcmp(write_buffer + write_buffer_parse_pos,payload,uStack_30), iVar5 == 0))
          {
            write_buffer_parse_pos = payload_length + write_buffer_parse_pos;
            payload_local._7_1_ = true;
          }
          else {
            payload_local._7_1_ = false;
          }
        }
        else {
          payload_local._7_1_ = false;
        }
      }
      else {
        payload_local._7_1_ = false;
        write_buffer_parse_pos = sVar6;
      }
    }
    else {
      payload_local._7_1_ = false;
      write_buffer_parse_pos = sVar6;
    }
  }
  else {
    payload_local._7_1_ = false;
    write_buffer_parse_pos = sVar6;
  }
  return payload_local._7_1_;
}

Assistant:

static bool check_frame(enum cio_websocket_frame_type opcode, const char *payload, size_t payload_length, bool is_last_frame)
{
	uint8_t header = write_buffer[write_buffer_parse_pos++];
	if (((header & WS_HEADER_FIN) == WS_HEADER_FIN) != is_last_frame) {
		return false;
	}

	if ((header & WS_HEADER_RSV) != 0) {
		return false;
	}

	if ((header & opcode) != opcode) {
		return false;
	}

	uint8_t first_length = write_buffer[write_buffer_parse_pos++];
	bool is_masked = ((first_length & WS_MASK_SET) == WS_MASK_SET);
	first_length = first_length & (uint8_t)~WS_MASK_SET;

	uint64_t length;
	if (first_length == 126) {
		uint16_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be16toh(len);
		length = len;
	} else if (first_length == 127) {
		uint64_t len;
		memcpy(&len, &write_buffer[write_buffer_parse_pos], sizeof(len));
		write_buffer_parse_pos += sizeof(len);
		len = cio_be64toh(len);
		length = len;
	} else {
		length = first_length;
	}

	if (length != payload_length) {
		return false;
	}

	if (is_masked) {
		uint8_t mask[4];
		memcpy(mask, &write_buffer[write_buffer_parse_pos], sizeof(mask));
		write_buffer_parse_pos += sizeof(mask);
		cio_websocket_mask(&write_buffer[write_buffer_parse_pos], (size_t)length, mask);
	}

	if (length > SIZE_MAX) {
		return false;
	}

	if (length > 0) {
		if (memcmp(&write_buffer[write_buffer_parse_pos], payload, (size_t)length) != 0) {
			return false;
		}
	}

	write_buffer_parse_pos += payload_length;

	return true;
}